

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::NodeRef>::
emplaceRealloc<slang::IntervalMapDetails::NodeRef_const&>
          (SmallVectorBase<slang::IntervalMapDetails::NodeRef> *this,pointer pos,NodeRef *args)

{
  pointer pNVar1;
  ulong uVar2;
  NodeRef *__cur_1;
  pointer pNVar3;
  pointer pNVar4;
  uintptr_t *puVar5;
  pointer pNVar6;
  EVP_PKEY_CTX *pEVar7;
  EVP_PKEY_CTX *ctx;
  long lVar8;
  
  if (this->len == 0xfffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar7 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar2 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar2 * 2);
  if (pEVar7 < ctx) {
    pEVar7 = ctx;
  }
  if (0xfffffffffffffff - uVar2 < uVar2) {
    pEVar7 = (EVP_PKEY_CTX *)0xfffffffffffffff;
  }
  lVar8 = (long)pos - (long)this->data_;
  pNVar3 = (pointer)operator_new((long)pEVar7 * 8);
  *(uintptr_t *)((long)pNVar3 + lVar8) = (args->pip).value;
  pNVar6 = this->data_;
  pNVar1 = pNVar6 + this->len;
  pNVar4 = pNVar3;
  if (pNVar1 == pos) {
    for (; pNVar6 != pos; pNVar6 = pNVar6 + 1) {
      (pNVar4->pip).value = (pNVar6->pip).value;
      pNVar4 = pNVar4 + 1;
    }
  }
  else {
    for (; pNVar6 != pos; pNVar6 = pNVar6 + 1) {
      ctx = (EVP_PKEY_CTX *)(pNVar6->pip).value;
      (pNVar4->pip).value = (uintptr_t)ctx;
      pNVar4 = pNVar4 + 1;
    }
    puVar5 = (uintptr_t *)(lVar8 + (long)pNVar3);
    for (; puVar5 = puVar5 + 1, pos != pNVar1; pos = pos + 1) {
      *puVar5 = (pos->pip).value;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar7;
  this->data_ = pNVar3;
  return (pointer)((long)pNVar3 + lVar8);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}